

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::AddPreservedBPsForTopLevelLoad
          (ExecutionInfoManager *this,uint32 topLevelBodyId,FunctionBody *body)

{
  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar1;
  Utf8SourceInfo *pUVar2;
  Type pTVar3;
  ScriptContext *pSVar4;
  Type *ppTVar5;
  long lVar6;
  int iVar7;
  BOOL local_34 [2];
  BOOL isNewBP;
  
  pSVar4 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
  if (0 < (this->m_unRestoredBreakpoints).
          super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
          .count) {
    pUVar2 = (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    this_00 = &this->m_unRestoredBreakpoints;
    lVar6 = 0;
    do {
      iVar7 = (int)lVar6;
      ppTVar5 = JsUtil::
                List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar7);
      if (*ppTVar5 != (Type)0x0) {
        ppTVar5 = JsUtil::
                  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,iVar7);
        pTVar3 = *ppTVar5;
        if (pTVar3->m_topLevelBodyId == topLevelBodyId) {
          local_34[0] = 0;
          (*(pSVar4->TTDHostCallbackFunctor).pfOnBPRegisterCallback)
                    ((pSVar4->TTDHostCallbackFunctor).HostRuntime,pTVar3->m_bpId,pSVar4,pUVar2,
                     pTVar3->m_line,pTVar3->m_column,local_34);
          if (local_34[0] == 0) {
            TTDAbort_unrecoverable_error
                      ("We should be restoring a breapoint we removed previously!");
          }
          iVar7 = iVar7 + 1;
          JsUtil::
          List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(this_00,iVar7);
          (this->m_unRestoredBreakpoints).
          super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
          .buffer[lVar6] = (TTDebuggerSourceLocation *)0x0;
          iVar1 = (this->m_unRestoredBreakpoints).
                  super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                  .count;
          if (iVar7 < iVar1) {
            iVar7 = iVar1;
          }
          (this->m_unRestoredBreakpoints).
          super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
          .count = iVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->m_unRestoredBreakpoints).
                     super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                     .count);
  }
  if ((((this->m_activeTTDBP).m_sourceScriptLogId != 0) && (this->m_activeBPId == -1)) &&
     ((this->m_activeTTDBP).m_topLevelBodyId == topLevelBodyId)) {
    pSVar4 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
    SetActiveBP_Helper(this,pSVar4->threadContext->TTDContext);
  }
  return;
}

Assistant:

void ExecutionInfoManager::AddPreservedBPsForTopLevelLoad(uint32 topLevelBodyId, Js::FunctionBody* body)
    {
        Js::ScriptContext* ctx = body->GetScriptContext();
        Js::Utf8SourceInfo* utf8SourceInfo = body->GetUtf8SourceInfo();

        for(int32 i = 0; i < this->m_unRestoredBreakpoints.Count(); ++i)
        {
            if(this->m_unRestoredBreakpoints.Item(i) == nullptr)
            {
                continue;
            }

            const TTDebuggerSourceLocation* bpLocation = this->m_unRestoredBreakpoints.Item(i);
            if(bpLocation->GetTopLevelBodyId() == topLevelBodyId)
            {
                BOOL isNewBP = FALSE;
                ctx->TTDHostCallbackFunctor.pfOnBPRegisterCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpLocation->GetBPId(), ctx, utf8SourceInfo, bpLocation->GetSourceLine(), bpLocation->GetSourceColumn(), &isNewBP);
                TTDAssert(isNewBP, "We should be restoring a breapoint we removed previously!");

                //Now that it is set we can clear it from our list
                this->m_unRestoredBreakpoints.SetItem(i, nullptr);
            }
        }

        if(this->m_activeTTDBP.HasValue() && (this->m_activeBPId == -1) && (this->m_activeTTDBP.GetTopLevelBodyId() == topLevelBodyId))
        {
            this->SetActiveBP_Helper(body->GetScriptContext()->GetThreadContext()->TTDContext);
        }
    }